

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

void mp_clear(mp_int *a)

{
  if (a->dp != (mp_digit *)0x0) {
    free(a->dp);
    a->dp = (mp_digit *)0x0;
    a->used = 0;
    a->alloc = 0;
    a->sign = 0;
  }
  return;
}

Assistant:

void mp_clear (mp_int * a)
{
  int i;

  /* only do anything if a hasn't been freed previously */
  if (a->dp != NULL) {
    /* first zero the digits */
    for (i = 0; i < a->used; i++) {
        a->dp[i] = 0;
    }

    /* free ram */
    XFREE(a->dp);

    /* reset members to make debugging easier */
    a->dp    = NULL;
    a->alloc = a->used = 0;
    a->sign  = MP_ZPOS;
  }
}